

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

ConfigDeclarationSyntax * __thiscall
slang::parsing::Parser::parseConfigDeclaration(Parser *this,AttrList attributes)

{
  SyntaxFactory *this_00;
  Token semi1;
  Token design;
  Token semi2;
  Token TVar1;
  bool bVar2;
  TokenKind TVar3;
  SyntaxKind SVar4;
  int iVar5;
  ParameterDeclarationBaseSyntax *parameter;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar6;
  ConfigCellIdentifierSyntax *pCVar7;
  SourceLocation location;
  Diagnostic *pDVar8;
  ConfigLiblistSyntax *pCVar9;
  undefined8 uVar10;
  undefined4 extraout_var;
  NamedBlockClauseSyntax *endBlock;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ConfigDeclarationSyntax *pCVar11;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *src_01;
  EVP_PKEY_CTX *src_02;
  byte *pbVar12;
  ulong uVar13;
  SyntaxNode *this_01;
  long lVar14;
  Token TVar15;
  Token nameToken;
  SourceRange SVar16;
  Token TVar17;
  Token TVar18;
  string_view sVar19;
  Token config;
  Token topModule;
  SmallVector<slang::syntax::ConfigInstanceIdentifierSyntax_*,_5UL> instanceNames;
  Token token;
  SmallVector<slang::syntax::ConfigRuleSyntax_*,_5UL> rules;
  SmallVector<slang::syntax::ConfigCellIdentifierSyntax_*,_5UL> topCells;
  SmallVector<slang::syntax::ParameterDeclarationStatementSyntax_*,_5UL> localparams;
  SyntaxNode *local_2a8;
  undefined1 local_290 [32];
  size_t local_270;
  pointer local_268;
  __extent_storage<18446744073709551615UL> local_260;
  Token local_250;
  SyntaxNode *local_240;
  SyntaxNode *pSStack_238;
  pointer local_228;
  SyntaxList<slang::syntax::ConfigInstanceIdentifierSyntax> local_218;
  undefined1 local_1e0 [64];
  Info *local_1a0;
  undefined8 local_198;
  Info *local_190;
  undefined8 local_188;
  Info *local_180;
  undefined8 local_178;
  Info *local_170;
  undefined8 local_168;
  pointer local_160;
  size_t local_158;
  Info *local_150;
  Token local_148;
  undefined8 local_138;
  Info *pIStack_130;
  undefined8 local_128;
  Info *pIStack_120;
  undefined8 local_118;
  Info *pIStack_110;
  Token local_108;
  Token local_f8;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_e8;
  SyntaxList<slang::syntax::ConfigRuleSyntax> local_a8;
  SmallVectorBase<slang::syntax::ParameterDeclarationStatementSyntax_*> local_70 [2];
  
  local_158 = (size_t)attributes._M_extent._M_extent_value;
  local_160 = attributes._M_ptr;
  TVar15 = ParserBase::consume(&this->super_ParserBase);
  local_180 = TVar15.info;
  local_178 = TVar15._0_8_;
  nameToken = ParserBase::expect(&this->super_ParserBase,Identifier);
  TVar15 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  local_70[0].data_ = (pointer)local_70[0].firstElement;
  local_70[0].len = 0;
  local_70[0].cap = 5;
  this_00 = &this->factory;
  do {
    do {
      local_170 = TVar15.info;
      local_168 = TVar15._0_8_;
      bVar2 = ParserBase::peek(&this->super_ParserBase,LocalParamKeyword);
      if (!bVar2) {
        TVar17 = ParserBase::expect(&this->super_ParserBase,DesignKeyword);
        local_e8.super_SyntaxListBase._vptr_SyntaxListBase =
             (_func_int **)&local_e8.super_SyntaxListBase.super_SyntaxNode.previewNode;
        local_e8.super_SyntaxListBase.super_SyntaxNode._0_8_ = 0;
        local_e8.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x5;
        while( true ) {
          local_190 = TVar17.info;
          local_188 = TVar17._0_8_;
          bVar2 = ParserBase::peek(&this->super_ParserBase,Identifier);
          if (!bVar2) break;
          pCVar7 = parseConfigCellIdentifier(this);
          local_1e0._0_8_ = pCVar7;
          SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax*>::
          emplace_back<slang::syntax::ConfigCellIdentifierSyntax*>
                    ((SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax*> *)&local_e8,
                     (ConfigCellIdentifierSyntax **)local_1e0);
          bVar2 = ParserBase::peek(&this->super_ParserBase,Comma);
          TVar17.info = local_190;
          TVar17.kind = (undefined2)local_188;
          TVar17._2_1_ = local_188._2_1_;
          TVar17.numFlags.raw = local_188._3_1_;
          TVar17.rawLen = local_188._4_4_;
          if (bVar2) {
            ParserBase::skipToken(&this->super_ParserBase,(optional<slang::DiagCode>)0x100850005);
            TVar17.info = local_190;
            TVar17.kind = (undefined2)local_188;
            TVar17._2_1_ = local_188._2_1_;
            TVar17.numFlags.raw = local_188._3_1_;
            TVar17.rawLen = local_188._4_4_;
          }
        }
        if (local_e8.super_SyntaxListBase.super_SyntaxNode._0_8_ == 0) {
          local_1e0._0_16_ = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
          location = Token::location((Token *)local_1e0);
          ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x410005,location);
        }
        TVar18 = ParserBase::expect(&this->super_ParserBase,Semicolon);
        local_1e0._8_8_ = 0;
        local_1e0._0_8_ = local_1e0 + 0x18;
        local_1e0._16_8_ = 5;
        local_2a8 = (SyntaxNode *)0x0;
        while( true ) {
          while( true ) {
            while( true ) {
              local_1a0 = TVar18.info;
              local_198 = TVar18._0_8_;
              local_250 = ParserBase::peek(&this->super_ParserBase);
              TVar3 = local_250.kind;
              if (TVar3 != CellKeyword) break;
              ParserBase::consume(&this->super_ParserBase);
              pCVar7 = parseConfigCellIdentifier(this);
              bVar2 = ParserBase::peek(&this->super_ParserBase,UseKeyword);
              if (bVar2) {
                pCVar9 = (ConfigLiblistSyntax *)parseConfigUseClause(this);
              }
              else {
                pCVar9 = parseConfigLiblist(this);
              }
              sVar19 = Token::valueText(&pCVar7->library);
              if ((sVar19._M_len != 0) &&
                 ((pCVar9->super_ConfigRuleClauseSyntax).super_SyntaxNode.kind == ConfigLiblist)) {
                SVar16 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)pCVar9);
                pDVar8 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xd0005,SVar16);
                SVar16 = Token::range(&pCVar7->library);
                Diagnostic::operator<<(pDVar8,SVar16);
              }
              TVar15 = local_250;
              local_f8 = ParserBase::expect(&this->super_ParserBase,Semicolon);
              local_290._0_8_ =
                   slang::syntax::SyntaxFactory::cellConfigRule
                             (this_00,TVar15,pCVar7,&pCVar9->super_ConfigRuleClauseSyntax,local_f8);
              SmallVectorBase<slang::syntax::ConfigRuleSyntax*>::
              emplace_back<slang::syntax::ConfigRuleSyntax*>
                        ((SmallVectorBase<slang::syntax::ConfigRuleSyntax*> *)local_1e0,
                         (ConfigRuleSyntax **)local_290);
              TVar18.info = local_1a0;
              TVar18.kind = (undefined2)local_198;
              TVar18._2_1_ = local_198._2_1_;
              TVar18.numFlags.raw = local_198._3_1_;
              TVar18.rawLen = local_198._4_4_;
            }
            if (TVar3 != InstanceKeyword) break;
            ParserBase::consume(&this->super_ParserBase);
            TVar15 = ParserBase::expect(&this->super_ParserBase,Identifier);
            uVar10 = TVar15._0_8_;
            local_290._0_8_ = local_290 + 0x18;
            local_290._8_8_ = 0;
            local_290._16_8_ = (SyntaxNode *)0x5;
            while (bVar2 = ParserBase::peek(&this->super_ParserBase,Dot), bVar2) {
              TVar17 = ParserBase::consume(&this->super_ParserBase);
              TVar18 = ParserBase::expect(&this->super_ParserBase,Identifier);
              local_218.super_SyntaxListBase._vptr_SyntaxListBase =
                   (_func_int **)
                   slang::syntax::SyntaxFactory::configInstanceIdentifier(this_00,TVar17,TVar18);
              SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax*>::
              emplace_back<slang::syntax::ConfigInstanceIdentifierSyntax*>
                        ((SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax*> *)
                         local_290,(ConfigInstanceIdentifierSyntax **)&local_218);
            }
            bVar2 = ParserBase::peek(&this->super_ParserBase,UseKeyword);
            local_150 = TVar15.info;
            if (bVar2) {
              pCVar9 = (ConfigLiblistSyntax *)parseConfigUseClause(this);
              src = extraout_RDX;
            }
            else {
              pCVar9 = parseConfigLiblist(this);
              src = extraout_RDX_00;
            }
            TVar15 = local_250;
            iVar5 = SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*>::copy
                              ((SmallVectorBase<slang::syntax::ConfigInstanceIdentifierSyntax_*> *)
                               local_290,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
            local_218.
            super_span<slang::syntax::ConfigInstanceIdentifierSyntax_*,_18446744073709551615UL>.
            _M_ptr = (pointer)CONCAT44(extraout_var,iVar5);
            local_218.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
            local_218.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
            local_218.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
            local_218.super_SyntaxListBase._vptr_SyntaxListBase =
                 (_func_int **)&PTR_getChild_006241c0;
            local_108 = ParserBase::expect(&this->super_ParserBase,Semicolon);
            topModule.info = local_150;
            topModule.kind = (short)uVar10;
            topModule._2_1_ = (char)((ulong)uVar10 >> 0x10);
            topModule.numFlags.raw = (char)((ulong)uVar10 >> 0x18);
            topModule.rawLen = (int)((ulong)uVar10 >> 0x20);
            local_a8.super_SyntaxListBase._vptr_SyntaxListBase =
                 (_func_int **)
                 slang::syntax::SyntaxFactory::instanceConfigRule
                           (this_00,TVar15,topModule,&local_218,
                            &pCVar9->super_ConfigRuleClauseSyntax,local_108);
            SmallVectorBase<slang::syntax::ConfigRuleSyntax*>::
            emplace_back<slang::syntax::ConfigRuleSyntax*>
                      ((SmallVectorBase<slang::syntax::ConfigRuleSyntax*> *)local_1e0,
                       (ConfigRuleSyntax **)&local_a8);
            TVar18.info = local_1a0;
            TVar18.kind = (undefined2)local_198;
            TVar18._2_1_ = local_198._2_1_;
            TVar18.numFlags.raw = local_198._3_1_;
            TVar18.rawLen = local_198._4_4_;
            if ((ParameterDeclarationStatementSyntax *)local_290._0_8_ !=
                (ParameterDeclarationStatementSyntax *)(local_290 + 0x18)) {
              operator_delete((void *)local_290._0_8_);
              TVar18.info = local_1a0;
              TVar18.kind = (undefined2)local_198;
              TVar18._2_1_ = local_198._2_1_;
              TVar18.numFlags.raw = local_198._3_1_;
              TVar18.rawLen = local_198._4_4_;
            }
          }
          if (TVar3 != DefaultKeyword) break;
          if (local_2a8 != (SyntaxNode *)0x0) {
            SVar16 = Token::range(&local_250);
            pDVar8 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x800005,SVar16);
            SVar16 = slang::syntax::SyntaxNode::sourceRange(local_2a8);
            Diagnostic::addNote(pDVar8,(DiagCode)0xa0001,SVar16);
          }
          ParserBase::consume(&this->super_ParserBase);
          pCVar9 = parseConfigLiblist(this);
          TVar15 = local_250;
          TVar17 = ParserBase::expect(&this->super_ParserBase,Semicolon);
          local_290._0_8_ =
               slang::syntax::SyntaxFactory::defaultConfigRule(this_00,TVar15,pCVar9,TVar17);
          SmallVectorBase<slang::syntax::ConfigRuleSyntax*>::
          emplace_back<slang::syntax::ConfigRuleSyntax*>
                    ((SmallVectorBase<slang::syntax::ConfigRuleSyntax*> *)local_1e0,
                     (ConfigRuleSyntax **)local_290);
          TVar18.info = local_1a0;
          TVar18.kind = (undefined2)local_198;
          TVar18._2_1_ = local_198._2_1_;
          TVar18.numFlags.raw = local_198._3_1_;
          TVar18.rawLen = local_198._4_4_;
          local_2a8 = *(SyntaxNode **)(local_1e0._0_8_ + local_1e0._8_8_ * 8 + -8);
        }
        TVar15 = ParserBase::expect(&this->super_ParserBase,EndConfigKeyword);
        endBlock = parseNamedBlockClause(this);
        checkBlockNames(this,nameToken,endBlock);
        local_290._8_4_ = 1;
        local_290._16_8_ = (SyntaxNode *)0x0;
        local_290[0x18] = '\0';
        local_290[0x19] = '\0';
        local_290[0x1a] = '\0';
        local_290[0x1b] = '\0';
        local_290[0x1c] = '\0';
        local_290[0x1d] = '\0';
        local_290[0x1e] = '\0';
        local_290[0x1f] = '\0';
        local_270 = local_158;
        local_268 = local_160;
        local_260._M_extent_value = local_158;
        local_290._0_8_ = &PTR_getChild_00623138;
        local_118 = local_168;
        pIStack_110 = local_170;
        iVar5 = SmallVectorBase<slang::syntax::ParameterDeclarationStatementSyntax_*>::copy
                          (local_70,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src_00);
        local_218.
        super_span<slang::syntax::ConfigInstanceIdentifierSyntax_*,_18446744073709551615UL>._M_ptr =
             (pointer)CONCAT44(extraout_var_00,iVar5);
        local_218.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
        local_218.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
        local_218.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
        local_218.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00624248;
        local_128 = local_188;
        pIStack_120 = local_190;
        iVar5 = SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*>::copy
                          ((SmallVectorBase<slang::syntax::ConfigCellIdentifierSyntax_*> *)&local_e8
                           ,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src_01);
        local_228 = (pointer)CONCAT44(extraout_var_01,iVar5);
        local_250.info._0_4_ = 1;
        local_240 = (SyntaxNode *)0x0;
        pSStack_238 = (SyntaxNode *)0x0;
        local_250._0_8_ = &PTR_getChild_006242d0;
        local_138 = local_198;
        pIStack_130 = local_1a0;
        iVar5 = SmallVectorBase<slang::syntax::ConfigRuleSyntax_*>::copy
                          ((SmallVectorBase<slang::syntax::ConfigRuleSyntax_*> *)local_1e0,
                           (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src_02);
        local_a8.super_span<slang::syntax::ConfigRuleSyntax_*,_18446744073709551615UL>._M_ptr =
             (pointer)CONCAT44(extraout_var_02,iVar5);
        local_a8.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
        local_a8.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
        local_a8.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
        local_a8.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00624358;
        semi1.info = pIStack_110;
        semi1.kind = (undefined2)local_118;
        semi1._2_1_ = local_118._2_1_;
        semi1.numFlags.raw = local_118._3_1_;
        semi1.rawLen = local_118._4_4_;
        design.info = pIStack_120;
        design.kind = (undefined2)local_128;
        design._2_1_ = local_128._2_1_;
        design.numFlags.raw = local_128._3_1_;
        design.rawLen = local_128._4_4_;
        semi2.info = pIStack_130;
        semi2.kind = (undefined2)local_138;
        semi2._2_1_ = local_138._2_1_;
        semi2.numFlags.raw = local_138._3_1_;
        semi2.rawLen = local_138._4_4_;
        config.info = local_180;
        config.kind = (undefined2)local_178;
        config._2_1_ = local_178._2_1_;
        config.numFlags.raw = local_178._3_1_;
        config.rawLen = local_178._4_4_;
        local_148 = TVar15;
        pCVar11 = slang::syntax::SyntaxFactory::configDeclaration
                            (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_290
                             ,config,nameToken,semi1,
                             (SyntaxList<slang::syntax::ParameterDeclarationStatementSyntax> *)
                             &local_218,design,
                             (SyntaxList<slang::syntax::ConfigCellIdentifierSyntax> *)&local_250,
                             semi2,&local_a8,TVar15,endBlock);
        if ((ConfigCellIdentifierSyntax *)local_1e0._0_8_ !=
            (ConfigCellIdentifierSyntax *)(local_1e0 + 0x18)) {
          operator_delete((void *)local_1e0._0_8_);
        }
        if ((SyntaxNode **)local_e8.super_SyntaxListBase._vptr_SyntaxListBase !=
            &local_e8.super_SyntaxListBase.super_SyntaxNode.previewNode) {
          operator_delete(local_e8.super_SyntaxListBase._vptr_SyntaxListBase);
        }
        if (local_70[0].data_ != (pointer)local_70[0].firstElement) {
          operator_delete(local_70[0].data_);
        }
        return pCVar11;
      }
      Token::Token((Token *)local_1e0);
      TVar15 = ParserBase::consume(&this->super_ParserBase);
      parameter = parseParameterDecl(this,TVar15,(Token *)local_1e0);
      local_e8.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
      local_e8.super_SyntaxListBase.childCount = 0;
      local_e8.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
           (pointer)0x0;
      local_e8.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
      local_e8.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
      local_e8.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
      _M_extent._M_extent_value = 0;
      local_e8.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_00623138;
      local_290._0_8_ =
           slang::syntax::SyntaxFactory::parameterDeclarationStatement
                     (this_00,&local_e8,parameter,(Token)local_1e0._0_16_);
      SmallVectorBase<slang::syntax::ParameterDeclarationStatementSyntax*>::
      emplace_back<slang::syntax::ParameterDeclarationStatementSyntax*>
                ((SmallVectorBase<slang::syntax::ParameterDeclarationStatementSyntax*> *)local_70,
                 (ParameterDeclarationStatementSyntax **)local_290);
      TVar1.info = local_170;
      TVar1.kind = (undefined2)local_168;
      TVar1._2_1_ = local_168._2_1_;
      TVar1.numFlags.raw = local_168._3_1_;
      TVar1.rawLen = local_168._4_4_;
      TVar15.info = local_170;
      TVar15.kind = (undefined2)local_168;
      TVar15._2_1_ = local_168._2_1_;
      TVar15.numFlags.raw = local_168._3_1_;
      TVar15.rawLen = local_168._4_4_;
    } while (((parameter->super_SyntaxNode).kind != ParameterDeclaration) ||
            (pbVar12 = (byte *)((long)&(parameter[2].super_SyntaxNode.previewNode)->kind + 1),
            TVar15 = TVar1, pbVar12 < (byte *)0x2));
    uVar13 = (ulong)pbVar12 >> 1;
    lVar14 = 0;
    do {
      ppSVar6 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(parameter[2].super_SyntaxNode.parent)->kind + lVar14));
      if (*(long *)(*ppSVar6 + 4) != 0) {
        this_01 = *(SyntaxNode **)(*(long *)(*ppSVar6 + 4) + 0x28);
        SVar4 = this_01->kind;
        if (SVar4 == ParenthesizedExpression) {
          this_01 = this_01[1].previewNode;
          SVar4 = this_01->kind;
        }
        if ((int)SVar4 < 0x18d) {
          if (((SVar4 != IntegerLiteralExpression) && (SVar4 != IntegerVectorExpression)) &&
             (SVar4 != NullLiteralExpression)) goto LAB_001e8f7d;
        }
        else if (((0x3a < SVar4 - StringLiteralExpression) ||
                 ((0x400000000040001U >> ((ulong)(SVar4 - StringLiteralExpression) & 0x3f) & 1) == 0
                 )) && (SVar4 != RealLiteralExpression)) {
LAB_001e8f7d:
          SVar16 = slang::syntax::SyntaxNode::sourceRange(this_01);
          ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xb0005,SVar16);
        }
      }
      TVar15.info = local_170;
      TVar15.kind = (undefined2)local_168;
      TVar15._2_1_ = local_168._2_1_;
      TVar15.numFlags.raw = local_168._3_1_;
      TVar15.rawLen = local_168._4_4_;
      lVar14 = lVar14 + 0x30;
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
  } while( true );
}

Assistant:

ConfigDeclarationSyntax& Parser::parseConfigDeclaration(AttrList attributes) {
    auto config = consume();
    auto name = expect(TokenKind::Identifier);
    auto semi1 = expect(TokenKind::Semicolon);

    SmallVector<ParameterDeclarationStatementSyntax*> localparams;
    while (peek(TokenKind::LocalParamKeyword)) {
        Token paramSemi;
        auto& paramBase = parseParameterDecl(consume(), &paramSemi);
        localparams.push_back(
            &factory.parameterDeclarationStatement(nullptr, paramBase, paramSemi));

        if (paramBase.kind == SyntaxKind::ParameterDeclaration) {
            for (auto decl : paramBase.as<ParameterDeclarationSyntax>().declarators) {
                if (decl->initializer) {
                    auto expr = decl->initializer->expr;
                    if (expr->kind == SyntaxKind::ParenthesizedExpression)
                        expr = expr->as<ParenthesizedExpressionSyntax>().expression;

                    switch (expr->kind) {
                        case SyntaxKind::NullLiteralExpression:
                        case SyntaxKind::StringLiteralExpression:
                        case SyntaxKind::RealLiteralExpression:
                        case SyntaxKind::TimeLiteralExpression:
                        case SyntaxKind::IntegerLiteralExpression:
                        case SyntaxKind::UnbasedUnsizedLiteralExpression:
                        case SyntaxKind::IntegerVectorExpression:
                            break;
                        default:
                            addDiag(diag::ConfigParamLiteral, expr->sourceRange());
                            break;
                    }
                }
            }
        }
    }

    auto design = expect(TokenKind::DesignKeyword);

    SmallVector<ConfigCellIdentifierSyntax*> topCells;
    while (peek(TokenKind::Identifier)) {
        topCells.push_back(&parseConfigCellIdentifier());
        if (peek(TokenKind::Comma))
            skipToken(diag::NoCommaInList);
    }

    if (topCells.empty())
        addDiag(diag::ExpectedIdentifier, peek().location());

    auto semi2 = expect(TokenKind::Semicolon);

    const ConfigRuleSyntax* defaultRule = nullptr;
    SmallVector<ConfigRuleSyntax*> rules;
    while (true) {
        auto token = peek();
        if (token.kind == TokenKind::DefaultKeyword) {
            if (defaultRule) {
                auto& diag = addDiag(diag::MultipleDefaultRules, token.range());
                diag.addNote(diag::NotePreviousDefinition, defaultRule->sourceRange());
            }

            consume();
            auto& liblist = parseConfigLiblist();
            rules.push_back(
                &factory.defaultConfigRule(token, liblist, expect(TokenKind::Semicolon)));
            defaultRule = rules.back();
        }
        else if (token.kind == TokenKind::CellKeyword) {
            consume();
            auto& cellName = parseConfigCellIdentifier();

            ConfigRuleClauseSyntax* rule;
            if (peek(TokenKind::UseKeyword))
                rule = &parseConfigUseClause();
            else
                rule = &parseConfigLiblist();

            if (!cellName.library.valueText().empty() && rule->kind == SyntaxKind::ConfigLiblist) {
                addDiag(diag::ConfigSpecificCellLiblist, rule->sourceRange())
                    << cellName.library.range();
            }

            rules.push_back(
                &factory.cellConfigRule(token, cellName, *rule, expect(TokenKind::Semicolon)));
        }
        else if (token.kind == TokenKind::InstanceKeyword) {
            consume();
            auto topModule = expect(TokenKind::Identifier);

            SmallVector<ConfigInstanceIdentifierSyntax*> instanceNames;
            while (peek(TokenKind::Dot)) {
                auto dot = consume();
                instanceNames.push_back(
                    &factory.configInstanceIdentifier(dot, expect(TokenKind::Identifier)));
            }

            ConfigRuleClauseSyntax* rule;
            if (peek(TokenKind::UseKeyword))
                rule = &parseConfigUseClause();
            else
                rule = &parseConfigLiblist();

            rules.push_back(&factory.instanceConfigRule(token, topModule, instanceNames.copy(alloc),
                                                        *rule, expect(TokenKind::Semicolon)));
        }
        else {
            break;
        }
    }

    auto endconfig = expect(TokenKind::EndConfigKeyword);
    auto blockName = parseNamedBlockClause();
    checkBlockNames(name, blockName);

    return factory.configDeclaration(attributes, config, name, semi1, localparams.copy(alloc),
                                     design, topCells.copy(alloc), semi2, rules.copy(alloc),
                                     endconfig, blockName);
}